

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O1

void uv__fs_scandir_cleanup(uv_fs_t *req)

{
  void *pvVar1;
  uint uVar2;
  
  uVar2 = req->nbufs;
  if ((uVar2 != 0) && (uVar2 != (uint)req->result)) {
    req->nbufs = uVar2 - 1;
  }
  uVar2 = req->nbufs;
  if (uVar2 < (uint)req->result) {
    pvVar1 = req->ptr;
    do {
      free(*(void **)((long)pvVar1 + (ulong)uVar2 * 8));
      uVar2 = req->nbufs + 1;
      req->nbufs = uVar2;
    } while (uVar2 < (uint)req->result);
  }
  free(req->ptr);
  req->ptr = (void *)0x0;
  return;
}

Assistant:

void uv__fs_scandir_cleanup(uv_fs_t* req) {
  uv__dirent_t** dents;

  unsigned int* nbufs = uv__get_nbufs(req);

  dents = req->ptr;
  if (*nbufs > 0 && *nbufs != (unsigned int) req->result)
    (*nbufs)--;
  for (; *nbufs < (unsigned int) req->result; (*nbufs)++)
    uv__fs_scandir_free(dents[*nbufs]);

  uv__fs_scandir_free(req->ptr);
  req->ptr = NULL;
}